

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__resample_vertical_upsample(stbir__info *stbir_info,int n)

{
  float fVar1;
  int num_pixels;
  int channels_00;
  int alpha_channel_00;
  stbir_datatype sVar2;
  stbir_colorspace sVar3;
  int ring_buffer_num_entries;
  int begin_index;
  int first_scanline;
  int iVar4;
  int iVar5;
  float *pfVar6;
  void *pvVar7;
  float *encode_buffer_00;
  float *ring_buffer_00;
  int ring_buffer_length_00;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int local_104;
  int c;
  int in_pixel_index_4;
  float coefficient_4;
  float *ring_buffer_entry_4;
  int coefficient_index_4;
  int in_pixel_index_3;
  float coefficient_3;
  float *ring_buffer_entry_3;
  int coefficient_index_3;
  int in_pixel_index_2;
  float coefficient_2;
  float *ring_buffer_entry_2;
  int coefficient_index_2;
  int in_pixel_index_1;
  float coefficient_1;
  float *ring_buffer_entry_1;
  int coefficient_index_1;
  int in_pixel_index;
  float coefficient;
  float *ring_buffer_entry;
  int coefficient_index;
  int coefficient_group;
  int output_row_start;
  int n1;
  int n0;
  int ring_buffer_length;
  int ring_buffer_first_scanline;
  int ring_buffer_begin_index;
  float *ring_buffer;
  int contributor;
  int coefficient_counter;
  int coefficient_width;
  int decode;
  float *encode_buffer;
  void *output_data;
  int ring_buffer_entries;
  int colorspace;
  int type;
  int alpha_channel;
  int channels;
  float *vertical_coefficients;
  stbir__contributors *vertical_contributors;
  int output_w;
  int k;
  int x;
  int n_local;
  stbir__info *stbir_info_local;
  
  num_pixels = stbir_info->output_w;
  pfVar6 = stbir_info->vertical_coefficients;
  channels_00 = stbir_info->channels;
  alpha_channel_00 = stbir_info->alpha_channel;
  sVar2 = stbir_info->type;
  sVar3 = stbir_info->colorspace;
  ring_buffer_num_entries = stbir_info->ring_buffer_num_entries;
  pvVar7 = stbir_info->output_data;
  encode_buffer_00 = stbir_info->encode_buffer;
  ring_buffer_00 = stbir_info->ring_buffer;
  begin_index = stbir_info->ring_buffer_begin_index;
  first_scanline = stbir_info->ring_buffer_first_scanline;
  ring_buffer_length_00 = (int)((ulong)(long)stbir_info->ring_buffer_length_bytes >> 2);
  iVar8 = stbir_info->vertical_coefficient_width * n;
  vertical_contributors._4_4_ = stbir_info->vertical_contributors[n].n0;
  iVar4 = stbir_info->vertical_contributors[n].n1;
  iVar5 = stbir_info->output_stride_bytes;
  iVar9 = stbir__use_height_upsampling(stbir_info);
  if (iVar9 == 0) {
    __assert_fail("stbir__use_height_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x76a,"void stbir__resample_vertical_upsample(stbir__info *, int)");
  }
  memset(encode_buffer_00,0,(long)num_pixels * (long)channels_00 * 4);
  ring_buffer._4_4_ = 0;
  switch(channels_00) {
  case 1:
    for (; vertical_contributors._4_4_ <= iVar4;
        vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
      pfVar10 = stbir__get_ring_buffer_scanline
                          (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                           ring_buffer_num_entries,ring_buffer_length_00);
      fVar1 = pfVar6[iVar8 + ring_buffer._4_4_];
      for (output_w = 0; output_w < num_pixels; output_w = output_w + 1) {
        encode_buffer_00[output_w] = pfVar10[output_w] * fVar1 + encode_buffer_00[output_w];
      }
      ring_buffer._4_4_ = ring_buffer._4_4_ + 1;
    }
    break;
  case 2:
    for (; vertical_contributors._4_4_ <= iVar4;
        vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
      pfVar10 = stbir__get_ring_buffer_scanline
                          (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                           ring_buffer_num_entries,ring_buffer_length_00);
      fVar1 = pfVar6[iVar8 + ring_buffer._4_4_];
      for (output_w = 0; output_w < num_pixels; output_w = output_w + 1) {
        iVar9 = output_w * 2;
        encode_buffer_00[iVar9] = pfVar10[iVar9] * fVar1 + encode_buffer_00[iVar9];
        encode_buffer_00[iVar9 + 1] = pfVar10[iVar9 + 1] * fVar1 + encode_buffer_00[iVar9 + 1];
      }
      ring_buffer._4_4_ = ring_buffer._4_4_ + 1;
    }
    break;
  case 3:
    for (; vertical_contributors._4_4_ <= iVar4;
        vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
      pfVar10 = stbir__get_ring_buffer_scanline
                          (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                           ring_buffer_num_entries,ring_buffer_length_00);
      fVar1 = pfVar6[iVar8 + ring_buffer._4_4_];
      for (output_w = 0; output_w < num_pixels; output_w = output_w + 1) {
        iVar9 = output_w * 3;
        encode_buffer_00[iVar9] = pfVar10[iVar9] * fVar1 + encode_buffer_00[iVar9];
        encode_buffer_00[iVar9 + 1] = pfVar10[iVar9 + 1] * fVar1 + encode_buffer_00[iVar9 + 1];
        encode_buffer_00[iVar9 + 2] = pfVar10[iVar9 + 2] * fVar1 + encode_buffer_00[iVar9 + 2];
      }
      ring_buffer._4_4_ = ring_buffer._4_4_ + 1;
    }
    break;
  case 4:
    for (; vertical_contributors._4_4_ <= iVar4;
        vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
      pfVar10 = stbir__get_ring_buffer_scanline
                          (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                           ring_buffer_num_entries,ring_buffer_length_00);
      fVar1 = pfVar6[iVar8 + ring_buffer._4_4_];
      for (output_w = 0; output_w < num_pixels; output_w = output_w + 1) {
        iVar9 = output_w * 4;
        encode_buffer_00[iVar9] = pfVar10[iVar9] * fVar1 + encode_buffer_00[iVar9];
        encode_buffer_00[iVar9 + 1] = pfVar10[iVar9 + 1] * fVar1 + encode_buffer_00[iVar9 + 1];
        encode_buffer_00[iVar9 + 2] = pfVar10[iVar9 + 2] * fVar1 + encode_buffer_00[iVar9 + 2];
        encode_buffer_00[iVar9 + 3] = pfVar10[iVar9 + 3] * fVar1 + encode_buffer_00[iVar9 + 3];
      }
      ring_buffer._4_4_ = ring_buffer._4_4_ + 1;
    }
    break;
  default:
    for (; vertical_contributors._4_4_ <= iVar4;
        vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
      pfVar10 = stbir__get_ring_buffer_scanline
                          (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                           ring_buffer_num_entries,ring_buffer_length_00);
      fVar1 = pfVar6[iVar8 + ring_buffer._4_4_];
      for (output_w = 0; output_w < num_pixels; output_w = output_w + 1) {
        for (local_104 = 0; local_104 < channels_00; local_104 = local_104 + 1) {
          iVar9 = output_w * channels_00 + local_104;
          encode_buffer_00[iVar9] =
               pfVar10[output_w * channels_00 + local_104] * fVar1 + encode_buffer_00[iVar9];
        }
      }
      ring_buffer._4_4_ = ring_buffer._4_4_ + 1;
    }
  }
  stbir__encode_scanline
            (stbir_info,num_pixels,(void *)((long)pvVar7 + (long)(n * iVar5)),encode_buffer_00,
             channels_00,alpha_channel_00,sVar2 * 2 + sVar3);
  return;
}

Assistant:

static void stbir__resample_vertical_upsample(stbir__info* stbir_info, int n)
{
    int x, k;
    int output_w = stbir_info->output_w;
    stbir__contributors* vertical_contributors = stbir_info->vertical_contributors;
    float* vertical_coefficients = stbir_info->vertical_coefficients;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int ring_buffer_entries = stbir_info->ring_buffer_num_entries;
    void* output_data = stbir_info->output_data;
    float* encode_buffer = stbir_info->encode_buffer;
    int decode = STBIR__DECODE(type, colorspace);
    int coefficient_width = stbir_info->vertical_coefficient_width;
    int coefficient_counter;
    int contributor = n;

    float* ring_buffer = stbir_info->ring_buffer;
    int ring_buffer_begin_index = stbir_info->ring_buffer_begin_index;
    int ring_buffer_first_scanline = stbir_info->ring_buffer_first_scanline;
    int ring_buffer_length = stbir_info->ring_buffer_length_bytes/sizeof(float);

    int n0,n1, output_row_start;
    int coefficient_group = coefficient_width * contributor;

    n0 = vertical_contributors[contributor].n0;
    n1 = vertical_contributors[contributor].n1;

    output_row_start = n * stbir_info->output_stride_bytes;

    STBIR_ASSERT(stbir__use_height_upsampling(stbir_info));

    memset(encode_buffer, 0, output_w * sizeof(float) * channels);

    // I tried reblocking this for better cache usage of encode_buffer
    // (using x_outer, k, x_inner), but it lost speed. -- stb

    coefficient_counter = 0;
    switch (channels) {
        case 1:
            for (k = n0; k <= n1; k++)
            {
                int coefficient_index = coefficient_counter++;
                float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);
                float coefficient = vertical_coefficients[coefficient_group + coefficient_index];
                for (x = 0; x < output_w; ++x)
                {
                    int in_pixel_index = x * 1;
                    encode_buffer[in_pixel_index + 0] += ring_buffer_entry[in_pixel_index + 0] * coefficient;
                }
            }
            break;
        case 2:
            for (k = n0; k <= n1; k++)
            {
                int coefficient_index = coefficient_counter++;
                float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);
                float coefficient = vertical_coefficients[coefficient_group + coefficient_index];
                for (x = 0; x < output_w; ++x)
                {
                    int in_pixel_index = x * 2;
                    encode_buffer[in_pixel_index + 0] += ring_buffer_entry[in_pixel_index + 0] * coefficient;
                    encode_buffer[in_pixel_index + 1] += ring_buffer_entry[in_pixel_index + 1] * coefficient;
                }
            }
            break;
        case 3:
            for (k = n0; k <= n1; k++)
            {
                int coefficient_index = coefficient_counter++;
                float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);
                float coefficient = vertical_coefficients[coefficient_group + coefficient_index];
                for (x = 0; x < output_w; ++x)
                {
                    int in_pixel_index = x * 3;
                    encode_buffer[in_pixel_index + 0] += ring_buffer_entry[in_pixel_index + 0] * coefficient;
                    encode_buffer[in_pixel_index + 1] += ring_buffer_entry[in_pixel_index + 1] * coefficient;
                    encode_buffer[in_pixel_index + 2] += ring_buffer_entry[in_pixel_index + 2] * coefficient;
                }
            }
            break;
        case 4:
            for (k = n0; k <= n1; k++)
            {
                int coefficient_index = coefficient_counter++;
                float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);
                float coefficient = vertical_coefficients[coefficient_group + coefficient_index];
                for (x = 0; x < output_w; ++x)
                {
                    int in_pixel_index = x * 4;
                    encode_buffer[in_pixel_index + 0] += ring_buffer_entry[in_pixel_index + 0] * coefficient;
                    encode_buffer[in_pixel_index + 1] += ring_buffer_entry[in_pixel_index + 1] * coefficient;
                    encode_buffer[in_pixel_index + 2] += ring_buffer_entry[in_pixel_index + 2] * coefficient;
                    encode_buffer[in_pixel_index + 3] += ring_buffer_entry[in_pixel_index + 3] * coefficient;
                }
            }
            break;
        default:
            for (k = n0; k <= n1; k++)
            {
                int coefficient_index = coefficient_counter++;
                float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);
                float coefficient = vertical_coefficients[coefficient_group + coefficient_index];
                for (x = 0; x < output_w; ++x)
                {
                    int in_pixel_index = x * channels;
                    int c;
                    for (c = 0; c < channels; c++)
                        encode_buffer[in_pixel_index + c] += ring_buffer_entry[in_pixel_index + c] * coefficient;
                }
            }
            break;
    }
    stbir__encode_scanline(stbir_info, output_w, (char *) output_data + output_row_start, encode_buffer, channels, alpha_channel, decode);
}